

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

void CheckAndSortAliases(s_assenv *ae)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  s_alias *psVar6;
  int local_38;
  int crc;
  int du;
  int dm;
  int dw;
  int i;
  s_alias tmpalias;
  s_assenv *ae_local;
  
  dm = 0;
  do {
    if (ae->ialias + -1 <= dm) {
LAB_00130e60:
      if ((ae->ialias != 1) && (ae->alias[ae->ialias + -1].crc <= ae->alias[ae->ialias + -2].crc)) {
        if (ae->alias[ae->ialias + -1].crc < ae->alias->crc) {
          psVar6 = ae->alias + (ae->ialias + -1);
          pcVar4 = psVar6->alias;
          pcVar2 = psVar6->translation;
          iVar1 = psVar6->crc;
          iVar3 = psVar6->len;
          memmove(ae->alias + 1,ae->alias,(long)(ae->ialias + -1) * 0x18);
          psVar6 = ae->alias;
          psVar6->alias = pcVar4;
          psVar6->translation = pcVar2;
          psVar6->crc = iVar1;
          psVar6->len = iVar3;
        }
        else {
          iVar1 = ae->alias[ae->ialias + -1].crc;
          du = 0;
          local_38 = ae->ialias + -1;
          while ((du <= local_38 && (crc = (du + local_38) / 2, ae->alias[crc].crc != iVar1))) {
            if (iVar1 < ae->alias[crc].crc) {
              local_38 = crc + -1;
            }
            else if (ae->alias[crc].crc < iVar1) {
              du = crc + 1;
            }
          }
          if (ae->alias[crc].crc < iVar1) {
            crc = crc + 1;
          }
          psVar6 = ae->alias + (ae->ialias + -1);
          pcVar4 = psVar6->alias;
          pcVar2 = psVar6->translation;
          iVar1 = psVar6->crc;
          iVar3 = psVar6->len;
          memmove(ae->alias + (crc + 1),ae->alias + crc,(long)((ae->ialias + -1) - crc) * 0x18);
          psVar6 = ae->alias + crc;
          psVar6->alias = pcVar4;
          psVar6->translation = pcVar2;
          psVar6->crc = iVar1;
          psVar6->len = iVar3;
        }
      }
      return;
    }
    pcVar4 = strstr(ae->alias[ae->ialias + -1].translation,ae->alias[dm].alias);
    if (pcVar4 != (char *)0x0) {
      ExpressionFastTranslate(ae,&ae->alias[ae->ialias + -1].translation,2);
      sVar5 = strlen(ae->alias[ae->ialias + -1].translation);
      ae->alias[ae->ialias + -1].len = (int)sVar5;
      goto LAB_00130e60;
    }
    dm = dm + 1;
  } while( true );
}

Assistant:

void CheckAndSortAliases(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "CheckAndSortAliases"

	struct s_alias tmpalias;
	int i,dw,dm,du,crc;
	for (i=0;i<ae->ialias-1;i++) {
		/* is there previous aliases in the new alias? */
		if (strstr(ae->alias[ae->ialias-1].translation,ae->alias[i].alias)) {
			/* there is a match, apply alias translation */
			ExpressionFastTranslate(ae,&ae->alias[ae->ialias-1].translation,2);
			/* need to compute again len */
			ae->alias[ae->ialias-1].len=strlen(ae->alias[ae->ialias-1].translation);
			break;
		}
	}
	
	/* cas particuliers pour insertion en d�but ou fin de liste */
	if (ae->ialias-1) {
		if (ae->alias[ae->ialias-1].crc>ae->alias[ae->ialias-2].crc) {
			/* pas de tri il est d�j� au bon endroit */
		} else if (ae->alias[ae->ialias-1].crc<ae->alias[0].crc) {
			/* insertion tout en bas de liste */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[1],&ae->alias[0],sizeof(struct s_alias)*(ae->ialias-1));
			ae->alias[0]=tmpalias;
		} else {
			/* on cherche ou inserer */
			crc=ae->alias[ae->ialias-1].crc;
			dw=0;
			du=ae->ialias-1;
			while (dw<=du) {
				dm=(dw+du)/2;
				if (ae->alias[dm].crc==crc) {
					break;
				} else if (ae->alias[dm].crc>crc) {
					du=dm-1;
				} else if (ae->alias[dm].crc<crc) {
					dw=dm+1;
				}
			}
			/* ajustement */
			if (ae->alias[dm].crc<crc) dm++;
			/* insertion */
			tmpalias=ae->alias[ae->ialias-1];
			MemMove(&ae->alias[dm+1],&ae->alias[dm],sizeof(struct s_alias)*(ae->ialias-1-dm));
			ae->alias[dm]=tmpalias;
		}
	} else {
		/* one alias need no sort */
	}
}